

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unknown_field_set.cc
# Opt level: O3

void __thiscall
google::protobuf::UnknownFieldSet::AddField(UnknownFieldSet *this,UnknownField *field)

{
  anon_union_8_5_912831f5_for_data_ aVar1;
  uint32 uVar2;
  vector<google::protobuf::UnknownField,std::allocator<google::protobuf::UnknownField>> *this_00;
  iterator __position;
  
  this_00 = (vector<google::protobuf::UnknownField,std::allocator<google::protobuf::UnknownField>> *
            )this->fields_;
  if (this_00 ==
      (vector<google::protobuf::UnknownField,std::allocator<google::protobuf::UnknownField>> *)0x0)
  {
    this_00 = (vector<google::protobuf::UnknownField,std::allocator<google::protobuf::UnknownField>>
               *)operator_new(0x18);
    *(undefined8 *)&this_00->field_0x0 = 0;
    *(undefined8 *)(this_00 + 8) = 0;
    *(undefined8 *)(this_00 + 0x10) = 0;
    this->fields_ =
         (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *)
         this_00;
  }
  __position._M_current = *(UnknownField **)(this_00 + 8);
  if (__position._M_current == *(UnknownField **)(this_00 + 0x10)) {
    std::vector<google::protobuf::UnknownField,std::allocator<google::protobuf::UnknownField>>::
    _M_realloc_insert<google::protobuf::UnknownField_const&>(this_00,__position,field);
  }
  else {
    uVar2 = field->type_;
    aVar1 = field->data_;
    (__position._M_current)->number_ = field->number_;
    (__position._M_current)->type_ = uVar2;
    (__position._M_current)->data_ = aVar1;
    *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 0x10;
  }
  UnknownField::DeepCopy
            ((this->fields_->
             super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
             )._M_impl.super__Vector_impl_data._M_finish + -1,__position._M_current);
  return;
}

Assistant:

void UnknownFieldSet::AddField(const UnknownField& field) {
  if (fields_ == NULL) fields_ = new std::vector<UnknownField>();
  fields_->push_back(field);
  fields_->back().DeepCopy(field);
}